

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::StringFormatTask::checkArguments
          (StringFormatTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  Type *this_00;
  bool bVar2;
  bool bVar3;
  Diagnostic *diag;
  long lVar4;
  Type *unaff_R15;
  Type **local_58;
  Args local_40;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)this,context,false,args,range,2,0x7fffffff);
  local_58 = &pCVar1->errorType;
  if (bVar2) {
    bVar2 = false;
    lVar4 = 0;
    do {
      this_00 = (args->_M_ptr[lVar4]->type).ptr;
      bVar3 = Type::canBeStringLike(this_00);
      if (!bVar3) {
        diag = ASTContext::addDiag(context,(DiagCode)0x1b000b,args->_M_ptr[lVar4]->sourceRange);
        ast::operator<<(diag,this_00);
        unaff_R15 = *local_58;
        break;
      }
      lVar4 = lVar4 + 1;
      bVar2 = lVar4 != 1;
    } while (lVar4 == 1);
    if (!bVar2) {
      return unaff_R15;
    }
    local_40._M_extent._M_extent_value = (args->_M_extent)._M_extent_value - 1;
    local_40._M_ptr = args->_M_ptr + 1;
    bVar2 = FmtHelpers::checkSFormatArgs(context,&local_40);
    if (bVar2) {
      local_58 = &pCVar1->voidType;
    }
  }
  return *local_58;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, INT32_MAX))
            return comp.getErrorType();

        for (size_t i = 0; i < 2; i++) {
            const Type& ft = *args[i]->type;
            if (!ft.canBeStringLike()) {
                context.addDiag(diag::InvalidStringArg, args[i]->sourceRange) << ft;
                return comp.getErrorType();
            }
        }

        if (!FmtHelpers::checkSFormatArgs(context, args.subspan(1)))
            return comp.getErrorType();

        return comp.getVoidType();
    }